

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O2

uint32_t rest_rpc::MD5::MD5CE::GetPaddedMessageWord(char *data,uint32_t n,uint32_t m,uint32_t i)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  
  uVar1 = GetPaddedMessageByte(data,n,m,i);
  uVar2 = GetPaddedMessageByte(data,n,m,i + 1);
  uVar3 = GetPaddedMessageByte(data,n,m,i + 2);
  uVar4 = GetPaddedMessageByte(data,n,m,i + 3);
  return CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

static uint32_t GetPaddedMessageWord(const char *data, const uint32_t n,
                                       const uint32_t m, const uint32_t i) {
    //    DCHECK_EQ(i % 4, 0u);
    //    DCHECK_LT(i, m);
    //    DCHECK_LT(n, m);
    //    DCHECK_EQ(m % 64, 0u);
    return static_cast<uint32_t>(GetPaddedMessageByte(data, n, m, i)) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 1))
                                 << 8) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 2))
                                 << 16) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 3))
                                 << 24);
  }